

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::~Chapters(Chapters *this)

{
  int iVar1;
  Edition *pEVar2;
  Edition *this_00;
  Edition *e;
  Chapters *this_local;
  
  while (0 < this->m_editions_count) {
    iVar1 = this->m_editions_count;
    this->m_editions_count = iVar1 + -1;
    Edition::Clear(this->m_editions + (long)iVar1 + -1);
  }
  pEVar2 = this->m_editions;
  if (pEVar2 != (Edition *)0x0) {
    this_00 = pEVar2 + *(long *)&pEVar2[-1].m_atoms_size;
    while (pEVar2 != this_00) {
      this_00 = this_00 + -1;
      Edition::~Edition(this_00);
    }
    operator_delete__(&pEVar2[-1].m_atoms_size);
  }
  return;
}

Assistant:

Chapters::~Chapters() {
  while (m_editions_count > 0) {
    Edition& e = m_editions[--m_editions_count];
    e.Clear();
  }
  delete[] m_editions;
}